

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microfmt.hpp
# Opt level: O2

string * __thiscall
cpptrace::microfmt::detail::format<4ul,char_const*>
          (string *__return_storage_ptr__,detail *this,char *fmt_begin,char *fmt_end,
          array<cpptrace::microfmt::detail::format_value,_4UL> args)

{
  detail dVar1;
  detail *pdVar2;
  bool bVar3;
  detail dVar4;
  char *saved_it;
  anon_class_16_2_b3e63829 read_number;
  detail *local_a0;
  size_t local_98;
  detail *local_90;
  anon_class_16_2_dcdac0d9 local_88;
  anon_class_56_7_8906807c local_78;
  anon_class_16_2_b3e63829 local_40;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_98 = 0;
  local_a0 = this;
  local_90 = (detail *)fmt_begin;
  local_88.fmt_end = (char **)&local_90;
  local_88.it = (char **)&local_a0;
  local_40.it = (char **)&local_a0;
  local_40.fmt_end = (char **)&local_90;
  do {
    pdVar2 = local_a0;
    if (local_a0 == local_90) {
      return __return_storage_ptr__;
    }
    dVar1 = *local_a0;
    if ((dVar1 == (detail)0x7d) || (dVar1 == (detail)0x7b)) {
      if ((long)*local_88.fmt_end - (long)*local_88.it < 2) {
        dVar4 = (detail)0x0;
      }
      else {
        dVar4 = ((detail *)*local_88.it)[1];
      }
      if (dVar4 != dVar1) goto LAB_0018f2b9;
      pdVar2 = local_a0 + 1;
LAB_0018f30f:
      local_a0 = pdVar2;
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                (__return_storage_ptr__,(char)*local_a0);
    }
    else {
LAB_0018f2b9:
      if (local_a0 + 1 == local_90 || dVar1 != (detail)0x7b) goto LAB_0018f30f;
      local_78.arg_i = &local_98;
      local_78.args = &args;
      local_78.it = (char **)&local_a0;
      local_78.read_number = &local_40;
      local_78.fmt_end = (char **)&local_90;
      local_78.peek = &local_88;
      local_78.str = __return_storage_ptr__;
      bVar3 = format<4UL,_const_char_*>::anon_class_56_7_8906807c::operator()(&local_78);
      if (!bVar3) goto LAB_0018f30f;
    }
    local_a0 = local_a0 + 1;
  } while( true );
}

Assistant:

std::string format(It fmt_begin, It fmt_end, std::array<format_value, N> args) {
            std::string str;
            std::size_t arg_i = 0;
            auto it = fmt_begin;
            auto peek = [&] (std::size_t dist) -> char { // 0 on failure
                return fmt_end - it > signed(dist) ? *(it + dist) : 0;
            };
            auto read_number = [&] () -> int { // -1 on failure
                auto scan = it;
                int num = 0;
                while(scan != fmt_end && isdigit(*scan)) {
                    num *= 10;
                    num += *scan - '0';
                    scan++;
                }
                if(scan != it) {
                    it = scan;
                    return num;
                } else {
                    return -1;
                }
            };
            for(; it != fmt_end; it++) {
                if((*it == '{' || *it == '}') && peek(1) == *it) { // parse {{ and }} escapes
                    it++;
                } else if(*it == '{' && it + 1 != fmt_end) {
                    auto saved_it = it;
                    auto handle_formatter = [&] () {
                        it++;
                        format_options options;
                        // try to parse alignment
                        if(*it == '<' || *it == '>') {
                            options.align = *it++ == '<' ? alignment::left : alignment::right;
                        }
                        // try to parse width
                        auto width = read_number(); // handles fmt_end check
                        if(width != -1) {
                            options.width = width;
                        } else if(it != fmt_end && *it == '{') { // try to parse variable width
                            if(peek(1) != '}') {
                                return false;
                            }
                            it += 2;
                            options.width = arg_i < args.size() ? args[arg_i++].unwrap_int() : 0;
                        }
                        // try to parse fill/base
                        if(it != fmt_end && *it == ':') {
                            it++;
                            if(fmt_end - it > 1 && *it != '}' && peek(1) != '}') { // two chars before the }, fill+base
                                options.fill = *it++;
                                options.base = *it++;
                            } else if(it != fmt_end && *it != '}') { // one char before the }, just base
                                if(*it == 'd' || *it == 'h' || *it == 'H' || *it == 'o' || *it == 'b') {
                                    options.base = *it++;
                                } else {
                                    options.fill = *it++;
                                }
                            }
                        }
                        if(it == fmt_end || *it != '}') {
                            return false;
                        }
                        if(arg_i < args.size()) {
                            args[arg_i++].write(str, options);
                        }
                        return true;
                    };
                    if(handle_formatter()) {
                        continue; // If reached here, successfully parsed and wrote a formatter. Don't write *it.
                    }
                    it = saved_it; // go back
                }
                str += *it;
            }
            return str;
        }